

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compatibility_tests.cpp
# Opt level: O0

void __thiscall
test::iu_Compatibility_x_iutest_x_TestResult_Test::~iu_Compatibility_x_iutest_x_TestResult_Test
          (iu_Compatibility_x_iutest_x_TestResult_Test *this)

{
  iu_Compatibility_x_iutest_x_TestResult_Test *this_local;
  
  ~iu_Compatibility_x_iutest_x_TestResult_Test(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

IUTEST(Compatibility, TestResult)
{
    const ::iutest::TestInfo* testinfo = ::iutest::UnitTest::GetInstance()->current_test_info();
    IUTEST_ASSERT_NOTNULL(testinfo);
    const ::iutest::TestResult* result = testinfo->result();
    IUTEST_ASSERT_NOTNULL(result);

    (void)result->total_part_count();
    (void)result->test_property_count();
    (void)result->Passed();
    (void)result->Failed();
    (void)result->HasFatalFailure();
    (void)result->HasNonfatalFailure();
    (void)result->elapsed_time();

    (void)&::iutest::TestResult::GetTestPartResult;
    (void)&::iutest::TestResult::GetTestProperty;
}